

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp_common.c
# Opt level: O0

void set_dmsr_to_vdpp_reg(dmsr_params *p_dmsr_param,dmsr_reg *dmsr)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  ushort uVar4;
  RK_S32 RVar5;
  uint local_40;
  uint local_3c;
  RK_U16 diff_coring_y1;
  RK_U16 diff_coring_y0;
  RK_U32 tmp_diff_x;
  RK_U32 tmp_diff_y;
  RK_U16 contrast2conf_mapping_k;
  RK_U16 i;
  RK_U16 tmp_diff;
  RK_U16 adj_mapping_k [7];
  dmsr_reg *dmsr_local;
  dmsr_params *p_dmsr_param_local;
  
  dmsr->reg0 = (anon_struct_4_2_bd67da7d_for_reg0)
               ((uint)dmsr->reg0 & 0xffff0000 | p_dmsr_param->dmsr_edge_th_low_arr[0] & 0xffff);
  dmsr->reg0 = (anon_struct_4_2_bd67da7d_for_reg0)
               ((uint)dmsr->reg0 & 0xffff | p_dmsr_param->dmsr_edge_th_high_arr[0] << 0x10);
  dmsr->reg1 = (anon_struct_4_2_bd67da9d_for_reg1)
               ((uint)dmsr->reg1 & 0xffff0000 | p_dmsr_param->dmsr_edge_th_low_arr[1] & 0xffff);
  dmsr->reg1 = (anon_struct_4_2_bd67da9d_for_reg1)
               ((uint)dmsr->reg1 & 0xffff | p_dmsr_param->dmsr_edge_th_high_arr[1] << 0x10);
  dmsr->reg2 = (anon_struct_4_2_bd67dabd_for_reg2)
               ((uint)dmsr->reg2 & 0xffff0000 | p_dmsr_param->dmsr_edge_th_low_arr[2] & 0xffff);
  dmsr->reg2 = (anon_struct_4_2_bd67dabd_for_reg2)
               ((uint)dmsr->reg2 & 0xffff | p_dmsr_param->dmsr_edge_th_high_arr[2] << 0x10);
  dmsr->reg3 = (anon_struct_4_2_bd67dadd_for_reg3)
               ((uint)dmsr->reg3 & 0xffff0000 | p_dmsr_param->dmsr_edge_th_low_arr[3] & 0xffff);
  dmsr->reg3 = (anon_struct_4_2_bd67dadd_for_reg3)
               ((uint)dmsr->reg3 & 0xffff | p_dmsr_param->dmsr_edge_th_high_arr[3] << 0x10);
  dmsr->reg4 = (anon_struct_4_2_bd67dafd_for_reg4)
               ((uint)dmsr->reg4 & 0xffff0000 | p_dmsr_param->dmsr_edge_th_low_arr[4] & 0xffff);
  dmsr->reg4 = (anon_struct_4_2_bd67dafd_for_reg4)
               ((uint)dmsr->reg4 & 0xffff | p_dmsr_param->dmsr_edge_th_high_arr[4] << 0x10);
  dmsr->reg5 = (anon_struct_4_2_bd67db1d_for_reg5)
               ((uint)dmsr->reg5 & 0xffff0000 | p_dmsr_param->dmsr_edge_th_low_arr[5] & 0xffff);
  dmsr->reg5 = (anon_struct_4_2_bd67db1d_for_reg5)
               ((uint)dmsr->reg5 & 0xffff | p_dmsr_param->dmsr_edge_th_high_arr[5] << 0x10);
  dmsr->reg6 = (anon_struct_4_2_bd67db3d_for_reg6)
               ((uint)dmsr->reg6 & 0xffff0000 | p_dmsr_param->dmsr_edge_th_low_arr[6] & 0xffff);
  dmsr->reg6 = (anon_struct_4_2_bd67db3d_for_reg6)
               ((uint)dmsr->reg6 & 0xffff | p_dmsr_param->dmsr_edge_th_high_arr[6] << 0x10);
  for (tmp_diff_x._2_2_ = 0; tmp_diff_x._2_2_ < 7; tmp_diff_x._2_2_ = tmp_diff_x._2_2_ + 1) {
    tmp_diff_y._0_2_ =
         (short)p_dmsr_param->dmsr_edge_th_high_arr[tmp_diff_x._2_2_] -
         (short)p_dmsr_param->dmsr_edge_th_low_arr[tmp_diff_x._2_2_];
    if ((ushort)tmp_diff_y == 0) {
      local_3c = 1;
    }
    else {
      local_3c = (uint)(ushort)tmp_diff_y;
    }
    *(short *)((long)&tmp_diff_y + (ulong)tmp_diff_x._2_2_ * 2 + 2) =
         (short)(0xffff / (ulong)(long)(int)local_3c);
  }
  if (p_dmsr_param->dmsr_contrast_to_conf_map_x1 - p_dmsr_param->dmsr_contrast_to_conf_map_x0 < 2) {
    local_40 = 1;
  }
  else {
    local_40 = p_dmsr_param->dmsr_contrast_to_conf_map_x1 -
               p_dmsr_param->dmsr_contrast_to_conf_map_x0;
  }
  adj_mapping_k._6_8_ = dmsr;
  RVar5 = mpp_clip(((p_dmsr_param->dmsr_contrast_to_conf_map_y1 -
                    p_dmsr_param->dmsr_contrast_to_conf_map_y0) * 0x100) / local_40,0,0xffff);
  *(uint *)(adj_mapping_k._6_8_ + 0x1c) =
       *(uint *)(adj_mapping_k._6_8_ + 0x1c) & 0xffff0000 | (uint)tmp_diff_y._2_2_;
  *(uint *)(adj_mapping_k._6_8_ + 0x1c) =
       *(uint *)(adj_mapping_k._6_8_ + 0x1c) & 0xffff | (uint)contrast2conf_mapping_k << 0x10;
  *(uint *)(adj_mapping_k._6_8_ + 0x20) =
       *(uint *)(adj_mapping_k._6_8_ + 0x20) & 0xffff0000 | (uint)i;
  *(uint *)(adj_mapping_k._6_8_ + 0x20) =
       *(uint *)(adj_mapping_k._6_8_ + 0x20) & 0xffff | (uint)tmp_diff << 0x10;
  *(uint *)(adj_mapping_k._6_8_ + 0x24) =
       *(uint *)(adj_mapping_k._6_8_ + 0x24) & 0xffff0000 | (uint)adj_mapping_k[0];
  *(uint *)(adj_mapping_k._6_8_ + 0x24) =
       *(uint *)(adj_mapping_k._6_8_ + 0x24) & 0xffff | (uint)adj_mapping_k[1] << 0x10;
  *(uint *)(adj_mapping_k._6_8_ + 0x28) =
       *(uint *)(adj_mapping_k._6_8_ + 0x28) & 0xffff0000 | (uint)adj_mapping_k[2];
  *(uint *)(adj_mapping_k._6_8_ + 0x28) =
       *(uint *)(adj_mapping_k._6_8_ + 0x28) & 0xffff | RVar5 << 0x10;
  *(uint *)(adj_mapping_k._6_8_ + 0x2c) =
       *(uint *)(adj_mapping_k._6_8_ + 0x2c) & 0xffff0000 |
       p_dmsr_param->dmsr_contrast_to_conf_map_x0 & 0xffff;
  *(uint *)(adj_mapping_k._6_8_ + 0x2c) =
       *(uint *)(adj_mapping_k._6_8_ + 0x2c) & 0xffff |
       p_dmsr_param->dmsr_contrast_to_conf_map_x1 << 0x10;
  *(uint *)(adj_mapping_k._6_8_ + 0x30) =
       *(uint *)(adj_mapping_k._6_8_ + 0x30) & 0xffff0000 |
       p_dmsr_param->dmsr_contrast_to_conf_map_y0 & 0xffff;
  *(uint *)(adj_mapping_k._6_8_ + 0x30) =
       *(uint *)(adj_mapping_k._6_8_ + 0x30) & 0xffff |
       p_dmsr_param->dmsr_contrast_to_conf_map_y1 << 0x10;
  *(short *)(adj_mapping_k._6_8_ + 0x34) = (short)p_dmsr_param->dmsr_blk_flat_th;
  *(ushort *)(adj_mapping_k._6_8_ + 0x38) =
       *(ushort *)(adj_mapping_k._6_8_ + 0x38) & 0xff00 |
       (ushort)p_dmsr_param->dmsr_diff_core_th0 & 0xff;
  *(ushort *)(adj_mapping_k._6_8_ + 0x38) =
       *(ushort *)(adj_mapping_k._6_8_ + 0x38) & 0xff | (short)p_dmsr_param->dmsr_diff_core_th1 << 8
  ;
  *(uint *)(adj_mapping_k._6_8_ + 0x3c) =
       *(uint *)(adj_mapping_k._6_8_ + 0x3c) & 0xffffffc0 | p_dmsr_param->dmsr_diff_core_wgt0 & 0x3f
  ;
  *(uint *)(adj_mapping_k._6_8_ + 0x3c) =
       *(uint *)(adj_mapping_k._6_8_ + 0x3c) & 0xffffc0ff |
       (p_dmsr_param->dmsr_diff_core_wgt1 & 0x3f) << 8;
  *(uint *)(adj_mapping_k._6_8_ + 0x3c) =
       *(uint *)(adj_mapping_k._6_8_ + 0x3c) & 0xffc0ffff |
       (p_dmsr_param->dmsr_diff_core_wgt2 & 0x3f) << 0x10;
  uVar4 = (short)p_dmsr_param->dmsr_diff_core_th0 * (short)p_dmsr_param->dmsr_diff_core_wgt0;
  RVar1 = p_dmsr_param->dmsr_diff_core_th1;
  RVar2 = p_dmsr_param->dmsr_diff_core_th0;
  RVar3 = p_dmsr_param->dmsr_diff_core_wgt1;
  *(uint *)(adj_mapping_k._6_8_ + 0x40) =
       *(uint *)(adj_mapping_k._6_8_ + 0x40) & 0xffffc000 | uVar4 & 0x3fff;
  *(uint *)(adj_mapping_k._6_8_ + 0x40) =
       *(uint *)(adj_mapping_k._6_8_ + 0x40) & 0xc000ffff |
       ((ushort)(((short)RVar1 - (short)RVar2) * (short)RVar3 + uVar4) & 0x3fff) << 0x10;
  *(uint *)(adj_mapping_k._6_8_ + 0x44) =
       *(uint *)(adj_mapping_k._6_8_ + 0x44) & 0xffffffc0 |
       p_dmsr_param->dmsr_wgt_pri_gain_odd_1 & 0x3f;
  *(uint *)(adj_mapping_k._6_8_ + 0x44) =
       *(uint *)(adj_mapping_k._6_8_ + 0x44) & 0xffffc0ff |
       (p_dmsr_param->dmsr_wgt_pri_gain_even_1 & 0x3f) << 8;
  *(uint *)(adj_mapping_k._6_8_ + 0x44) =
       *(uint *)(adj_mapping_k._6_8_ + 0x44) & 0xffc0ffff |
       (p_dmsr_param->dmsr_wgt_pri_gain_odd_2 & 0x3f) << 0x10;
  *(uint *)(adj_mapping_k._6_8_ + 0x44) =
       *(uint *)(adj_mapping_k._6_8_ + 0x44) & 0xc0ffffff |
       (p_dmsr_param->dmsr_wgt_pri_gain_even_2 & 0x3f) << 0x18;
  *(ushort *)(adj_mapping_k._6_8_ + 0x48) =
       *(ushort *)(adj_mapping_k._6_8_ + 0x48) & 0xffc0 |
       (ushort)p_dmsr_param->dmsr_wgt_sec_gain & 0x3f;
  *(ushort *)(adj_mapping_k._6_8_ + 0x48) =
       *(ushort *)(adj_mapping_k._6_8_ + 0x48) & 0xc0ff |
       ((ushort)(p_dmsr_param->dmsr_wgt_sec_gain << 1) & 0x3f) << 8;
  *(uint *)(adj_mapping_k._6_8_ + 0x4c) =
       *(uint *)(adj_mapping_k._6_8_ + 0x4c) & 0xffffffe0 | p_dmsr_param->dmsr_str_pri_y & 0x1f;
  *(uint *)(adj_mapping_k._6_8_ + 0x4c) =
       *(uint *)(adj_mapping_k._6_8_ + 0x4c) & 0xffffe0ff |
       (p_dmsr_param->dmsr_str_sec_y & 0x1f) << 8;
  *(uint *)(adj_mapping_k._6_8_ + 0x4c) =
       *(uint *)(adj_mapping_k._6_8_ + 0x4c) & 0xfff0ffff |
       (p_dmsr_param->dmsr_dumping_y & 0xf) << 0x10;
  return;
}

Assistant:

void set_dmsr_to_vdpp_reg(struct dmsr_params* p_dmsr_param, struct dmsr_reg* dmsr)
{
    /* 0x0080(reg0) */
    dmsr->reg0.sw_dmsr_edge_low_thre_0 = p_dmsr_param->dmsr_edge_th_low_arr[0];
    dmsr->reg0.sw_dmsr_edge_high_thre_0 = p_dmsr_param->dmsr_edge_th_high_arr[0];

    /* 0x0084(reg1) */
    dmsr->reg1.sw_dmsr_edge_low_thre_1 = p_dmsr_param->dmsr_edge_th_low_arr[1];
    dmsr->reg1.sw_dmsr_edge_high_thre_1 = p_dmsr_param->dmsr_edge_th_high_arr[1];

    /* 0x0088(reg2) */
    dmsr->reg2.sw_dmsr_edge_low_thre_2 = p_dmsr_param->dmsr_edge_th_low_arr[2];
    dmsr->reg2.sw_dmsr_edge_high_thre_2 = p_dmsr_param->dmsr_edge_th_high_arr[2];

    /* 0x008C(reg3) */
    dmsr->reg3.sw_dmsr_edge_low_thre_3 = p_dmsr_param->dmsr_edge_th_low_arr[3];
    dmsr->reg3.sw_dmsr_edge_high_thre_3 = p_dmsr_param->dmsr_edge_th_high_arr[3];

    /* 0x0090(reg4) */
    dmsr->reg4.sw_dmsr_edge_low_thre_4 = p_dmsr_param->dmsr_edge_th_low_arr[4];
    dmsr->reg4.sw_dmsr_edge_high_thre_4 = p_dmsr_param->dmsr_edge_th_high_arr[4];

    /* 0x0094(reg5) */
    dmsr->reg5.sw_dmsr_edge_low_thre_5 = p_dmsr_param->dmsr_edge_th_low_arr[5];
    dmsr->reg5.sw_dmsr_edge_high_thre_5 = p_dmsr_param->dmsr_edge_th_high_arr[5];

    /* 0x0098(reg6) */
    dmsr->reg6.sw_dmsr_edge_low_thre_6 = p_dmsr_param->dmsr_edge_th_low_arr[6];
    dmsr->reg6.sw_dmsr_edge_high_thre_6 = p_dmsr_param->dmsr_edge_th_high_arr[6];
    {
        RK_U16 adj_mapping_k[7];
        RK_U16 tmp_diff;
        RK_U16 i;
        RK_U16 contrast2conf_mapping_k;
        RK_U32 tmp_diff_y, tmp_diff_x;

        for (i = 0; i < 7; i++) {
            tmp_diff =  p_dmsr_param->dmsr_edge_th_high_arr[i] - p_dmsr_param->dmsr_edge_th_low_arr[i];
            adj_mapping_k[i] = (65535 / MPP_MAX(1, tmp_diff));
        }
        tmp_diff_y = p_dmsr_param->dmsr_contrast_to_conf_map_y1 - p_dmsr_param->dmsr_contrast_to_conf_map_y0;
        tmp_diff_x = MPP_MAX(p_dmsr_param->dmsr_contrast_to_conf_map_x1 - p_dmsr_param->dmsr_contrast_to_conf_map_x0, 1);

        contrast2conf_mapping_k = mpp_clip(256 * tmp_diff_y / tmp_diff_x, 0, 65535);
        /* 0x009C(reg7) */
        dmsr->reg7.sw_dmsr_edge_k_0 = adj_mapping_k[0];
        dmsr->reg7.sw_dmsr_edge_k_1 = adj_mapping_k[1];

        /* 0x00A0(reg8) */
        dmsr->reg8.sw_dmsr_edge_k_2 = adj_mapping_k[2];
        dmsr->reg8.sw_dmsr_edge_k_3 = adj_mapping_k[3];

        /* 0x00A4(reg9) */
        dmsr->reg9.sw_dmsr_edge_k_4 = adj_mapping_k[4];
        dmsr->reg9.sw_dmsr_edge_k_5 = adj_mapping_k[5];

        /* 0x00A8(reg10) */
        dmsr->reg10.sw_dmsr_edge_k_6 = adj_mapping_k[6];
        dmsr->reg10.sw_dmsr_dir_contrast_conf_f = contrast2conf_mapping_k;
    }
    /* 0x00AC(reg11) */
    dmsr->reg11.sw_dmsr_dir_contrast_conf_x0 = p_dmsr_param->dmsr_contrast_to_conf_map_x0;
    dmsr->reg11.sw_dmsr_dir_contrast_conf_x1 = p_dmsr_param->dmsr_contrast_to_conf_map_x1;

    /* 0x00B0(reg12) */
    dmsr->reg12.sw_dmsr_dir_contrast_conf_y0 = p_dmsr_param->dmsr_contrast_to_conf_map_y0;
    dmsr->reg12.sw_dmsr_dir_contrast_conf_y1 = p_dmsr_param->dmsr_contrast_to_conf_map_y1;

    /* 0x00B4(reg13) */
    dmsr->reg13.sw_dmsr_var_th = p_dmsr_param->dmsr_blk_flat_th;

    /* 0x00B8(reg14) */
    dmsr->reg14.sw_dmsr_diff_coring_th0 = p_dmsr_param->dmsr_diff_core_th0;
    dmsr->reg14.sw_dmsr_diff_coring_th1 = p_dmsr_param->dmsr_diff_core_th1;

    /* 0x00BC(reg15) */
    dmsr->reg15.sw_dmsr_diff_coring_wgt0 = p_dmsr_param->dmsr_diff_core_wgt0;
    dmsr->reg15.sw_dmsr_diff_coring_wgt1 = p_dmsr_param->dmsr_diff_core_wgt1;
    dmsr->reg15.sw_dmsr_diff_coring_wgt2 = p_dmsr_param->dmsr_diff_core_wgt2;
    {
        RK_U16 diff_coring_y0 = p_dmsr_param->dmsr_diff_core_th0 * p_dmsr_param->dmsr_diff_core_wgt0;
        RK_U16 diff_coring_y1 = ((p_dmsr_param->dmsr_diff_core_th1 - p_dmsr_param->dmsr_diff_core_th0) * p_dmsr_param->dmsr_diff_core_wgt1) + diff_coring_y0;
        /* 0x00C0(reg16) */
        dmsr->reg16.sw_dmsr_diff_coring_y0 = diff_coring_y0;
        dmsr->reg16.sw_dmsr_diff_coring_y1 = diff_coring_y1;
    }
    /* 0x00C4(reg17) */
    dmsr->reg17.sw_dmsr_wgt_pri_gain_1_odd = p_dmsr_param->dmsr_wgt_pri_gain_odd_1;
    dmsr->reg17.sw_dmsr_wgt_pri_gain_1_even = p_dmsr_param->dmsr_wgt_pri_gain_even_1;
    dmsr->reg17.sw_dmsr_wgt_pri_gain_2_odd = p_dmsr_param->dmsr_wgt_pri_gain_odd_2;
    dmsr->reg17.sw_dmsr_wgt_pri_gain_2_even = p_dmsr_param->dmsr_wgt_pri_gain_even_2;

    /* 0x00C8(reg18) */
    dmsr->reg18.sw_dmsr_wgt_sec_gain_1 = p_dmsr_param->dmsr_wgt_sec_gain;
    dmsr->reg18.sw_dmsr_wgt_sec_gain_2 = p_dmsr_param->dmsr_wgt_sec_gain * 2;

    /* 0x00CC(reg19) */
    dmsr->reg19.sw_dmsr_strength_pri = p_dmsr_param->dmsr_str_pri_y;
    dmsr->reg19.sw_dmsr_strength_sec = p_dmsr_param->dmsr_str_sec_y;
    dmsr->reg19.sw_dmsr_dump = p_dmsr_param->dmsr_dumping_y;
}